

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

Promise<void> __thiscall kj::UnixEventPort::FdObserver::whenWriteDisconnected(FdObserver *this)

{
  Own<kj::PromiseFulfiller<void>_> *t;
  Promise<void> *pPVar1;
  PromiseNode *extraout_RDX;
  long in_RSI;
  Promise<void> PVar2;
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> local_48;
  undefined1 local_38 [8];
  PromiseFulfillerPair<void> paf;
  FdObserver *this_local;
  
  newPromiseAndFulfiller<void>();
  t = mv<kj::Own<kj::PromiseFulfiller<void>>>
                ((Own<kj::PromiseFulfiller<void>_> *)&paf.promise.super_PromiseBase.node.ptr);
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe(&local_48,t);
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::operator=
            ((Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)(in_RSI + 0x40),&local_48);
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::~Maybe(&local_48);
  pPVar1 = mv<kj::Promise<void>>((Promise<void> *)local_38);
  Promise<void>::Promise((Promise<void> *)this,pPVar1);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_38);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<void> UnixEventPort::FdObserver::whenWriteDisconnected() {
  auto paf = newPromiseAndFulfiller<void>();
  hupFulfiller = kj::mv(paf.fulfiller);
  return kj::mv(paf.promise);
}